

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_statement.cpp
# Opt level: O3

void __thiscall duckdb::OnConflictInfo::OnConflictInfo(OnConflictInfo *this,OnConflictInfo *other)

{
  unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true> *this_00;
  _Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_> __ptr_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RAX;
  pointer pPVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> local_28;
  
  this->action_type = other->action_type;
  local_28._M_head_impl =
       (UpdateSetInfo *)
       in_RAX._M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->indexed_columns,
           &(other->indexed_columns).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  this_00 = &this->set_info;
  (this->set_info).
  super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>.
  super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl = (UpdateSetInfo *)0x0;
  (this->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  if ((other->set_info).
      super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>.
      super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl != (UpdateSetInfo *)0x0) {
    unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::operator->
              (&other->set_info);
    UpdateSetInfo::Copy((UpdateSetInfo *)&stack0xffffffffffffffd8);
    __ptr_00.super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>)._M_t.
         super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>
         .super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>;
    (this_00->super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>).
    _M_t.super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>.
    super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> =
         (_Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>)local_28._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl !=
        (UpdateSetInfo *)0x0) {
      ::std::default_delete<duckdb::UpdateSetInfo>::operator()
                ((default_delete<duckdb::UpdateSetInfo> *)this_00,
                 (UpdateSetInfo *)
                 __ptr_00.super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl);
    }
  }
  if ((other->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&other->condition);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffd8,pPVar3);
    _Var2._M_head_impl = (ParsedExpression *)local_28._M_head_impl;
    local_28._M_head_impl = (UpdateSetInfo *)0x0;
    _Var1._M_head_impl =
         (this->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (this->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_28._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
  }
  return;
}

Assistant:

OnConflictInfo::OnConflictInfo(const OnConflictInfo &other)
    : action_type(other.action_type), indexed_columns(other.indexed_columns) {
	if (other.set_info) {
		set_info = other.set_info->Copy();
	}
	if (other.condition) {
		condition = other.condition->Copy();
	}
}